

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O1

void ywalg(double *x,int N,int p,double *phi)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  double *acorr;
  double *B;
  void *__src;
  double *A;
  double *C;
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  double dVar10;
  double local_38;
  
  sVar2 = (long)p * 8 + 8;
  acorr = (double *)malloc(sVar2);
  B = (double *)malloc(sVar2);
  sVar2 = (long)p * 8;
  __src = malloc(sVar2);
  A = (double *)malloc(sVar2);
  C = (double *)malloc(8);
  autocorr(x,N,acorr,p + 1);
  local_38 = *acorr;
  dVar10 = -acorr[1];
  *B = dVar10;
  if (1 < p) {
    lVar9 = 1;
    uVar7 = 0;
    pdVar8 = B;
    do {
      local_38 = (1.0 - dVar10 * dVar10) * local_38;
      pdVar4 = A;
      lVar6 = lVar9;
      do {
        *pdVar4 = acorr[lVar6];
        pdVar4 = pdVar4 + 1;
        lVar5 = lVar6 + -1;
        bVar3 = 0 < lVar6;
        lVar6 = lVar5;
      } while (lVar5 != 0 && bVar3);
      uVar1 = uVar7 + 1;
      mmult(A,B,C,1,(int)uVar1,1);
      dVar10 = -(*C + acorr[uVar7 + 2]) / local_38;
      lVar6 = 0;
      pdVar4 = pdVar8;
      do {
        *(double *)((long)__src + lVar6 * 8) = *pdVar4 * dVar10 + B[lVar6];
        lVar6 = lVar6 + 1;
        pdVar4 = pdVar4 + -1;
      } while (lVar9 != lVar6);
      memcpy(B,__src,uVar7 * 8 + 8);
      B[uVar1] = dVar10;
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 1;
      uVar7 = uVar1;
    } while (uVar1 != p - 1);
  }
  if (0 < p) {
    uVar7 = 0;
    do {
      phi[uVar7] = -B[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)p != uVar7);
  }
  free(acorr);
  free(__src);
  free(B);
  free(A);
  free(C);
  return;
}

Assistant:

void ywalg(double *x, int N, int p, double *phi) {
	int lag,k,j;
	double *acf,*z,*y,*temp1,*temp2;
	double a, b;

	lag = p + 1;
	acf = (double*)malloc(sizeof(double)* lag);
	y = (double*)malloc(sizeof(double)* lag);
	z = (double*)malloc(sizeof(double)* p);
	temp1 = (double*)malloc(sizeof(double)* p);
	temp2 = (double*)malloc(sizeof(double)* 1);

	autocorr(x, N, acf, lag);
	b = acf[0];
	a = y[0] = -acf[1];

	for (k = 0; k < p - 1; ++k) {
		b = (1 - a*a) * b;
		for (j = k; j >= 0; --j) {
			temp1[k-j] = acf[j+1];
		}
		mmult(temp1, y, temp2, 1, k + 1, 1);

		a = -(*temp2 + acf[k + 2]) / b;

		for (j = 0; j <= k; ++j) {
			z[j] = y[j] + a * y[k - j];
		}

		for (j = 0; j <= k; ++j) {
			y[j] = z[j];
		}
		y[k + 1] = a;

	}

	for (j = 0; j < p; ++j) {
		phi[j] = -1.0 * y[j];
	}


	free(acf); 
	free(z);
	free(y);
	free(temp1);
	free(temp2);
}